

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.c
# Opt level: O0

void frames_write_at(FrameArray *frame_arr,uint32_t index,CallFrame *frame)

{
  CallFrame **ppCVar1;
  uint32_t local_24;
  CallFrame *frame_local;
  uint32_t index_local;
  FrameArray *frame_arr_local;
  
  if (frame_arr->cap < index) {
    fprintf(_stderr,"Invalid write in frame array");
    exit(100);
  }
  if (index == frame_arr->cap) {
    if (frame_arr->cap < 8) {
      local_24 = 8;
    }
    else {
      local_24 = frame_arr->cap << 1;
    }
    frame_arr->cap = local_24;
    ppCVar1 = (CallFrame **)reallocate(frame_arr->frame_pointers,(ulong)frame_arr->cap << 3);
    frame_arr->frame_pointers = ppCVar1;
  }
  if (frame_arr->count <= index) {
    frame_arr->count = frame_arr->count + 1;
  }
  frame_arr->frame_pointers[index] = frame;
  return;
}

Assistant:

void frames_write_at(FrameArray *frame_arr, uint32_t index, CallFrame *frame) {
    if (index > frame_arr->cap) {
        fprintf(stderr, "Invalid write in frame array");
        exit(100);
    }

    if (index == frame_arr->cap) {
        frame_arr->cap = GROW_CAP(frame_arr->cap);
        frame_arr->frame_pointers = GROW_ARR(frame_arr->frame_pointers, CallFrame *, frame_arr->cap);
    }

    if (index >= frame_arr->count) {
        ++frame_arr->count;
    }

    frame_arr->frame_pointers[index] = frame;
}